

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_parse_cfg.c
# Opt level: O3

int lookup_opt_type(char *line)

{
  char *__s;
  int iVar1;
  size_t __n;
  long lVar2;
  
  lVar2 = 8;
  do {
    __s = *(char **)((long)&op_tbl[0].type + lVar2);
    __n = strlen(__s);
    iVar1 = strncmp(__s,line,__n);
    if (iVar1 == 0) {
      _mpp_log_l(4,0,"option type %s find\n",0,__s);
      return *(int *)((long)&__do_global_dtors_aux_fini_array_entry + lVar2);
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x68);
  return -1;
}

Assistant:

static int lookup_opt_type(char *line)
{
    size_t i;

    for (i = 0; i < ARRAY_SIZE(op_tbl); ++i) {
        if (!strncmp(op_tbl[i].type_str, line,
                     strlen(op_tbl[i].type_str))) {
            mpp_log("option type %s find\n", op_tbl[i].type_str);
            return op_tbl[i].type;
        }
    }

    return -1;
}